

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O3

void avro::testLimits(EncoderPtr *e,DecoderPtr *d)

{
  _func_int **pp_Var1;
  float fVar2;
  double dVar3;
  undefined8 local_110;
  double local_108;
  undefined8 *local_100;
  double *local_f8;
  undefined1 local_f0 [16];
  undefined8 *local_e0;
  char *local_d8;
  assertion_result local_d0;
  undefined8 **local_b8;
  auto_ptr<avro::InputStream> s2;
  auto_ptr<avro::OutputStream> s1;
  assertion_result local_a0;
  lazy_ostream local_88;
  undefined8 *local_78;
  lazy_ostream *local_70;
  _func_int **local_68;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  avro::memoryOutputStream((ulong)&s1);
  (**(code **)(*(long *)e->px + 0x10))(e->px,s1._M_ptr);
  (**(code **)(*(long *)e->px + 0x48))(0);
  (**(code **)(*(long *)e->px + 0x48))(0);
  (**(code **)(*(long *)e->px + 0x48))(0);
  (**(code **)(*(long *)e->px + 0x40))(0x7f800000);
  (**(code **)(*(long *)e->px + 0x40))(0xff800000);
  (**(code **)(*(long *)e->px + 0x40))(0x7fc00000);
  (**(code **)(*(long *)e->px + 0x18))();
  avro::memoryInputStream((OutputStream *)&s2);
  (**(code **)(*(long *)d->px + 0x10))();
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1db2b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1af701);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5ca;
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_001d6dd0;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_108 = (double)(**(code **)(*(long *)d->px + 0x40))();
  local_f8 = &local_108;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(INFINITY <= local_108);
  local_100 = &local_110;
  local_110 = 0x7ff0000000000000;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_60.m_end = "";
  local_70 = (lazy_ostream *)&local_f8;
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d6d90;
  local_78 = &boost::unit_test::lazy_ostream::inst;
  local_b8 = &local_100;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001d6d90;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_f0,&local_60,0x5ca,CHECK,CHECK_EQUAL,2,
             "d->decodeDouble()",&local_88,"std::numeric_limits<double>::infinity()",&local_d0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1db2b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1af701);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5cc;
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_68 = (_func_int **)&PTR__lazy_ostream_001d6dd0;
  local_f0._0_8_ = &PTR__lazy_ostream_001d6dd0;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_108 = (double)(**(code **)(*(long *)d->px + 0x40))();
  local_110 = 0xfff0000000000000;
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_108 <= -INFINITY);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_60.m_end = "";
  local_f8 = &local_108;
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d6d90;
  local_78 = &boost::unit_test::lazy_ostream::inst;
  local_70 = (lazy_ostream *)&local_f8;
  local_100 = &local_110;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001d6d90;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_f0,&local_60,0x5cc,CHECK,CHECK_EQUAL,2,
             "d->decodeDouble()",&local_88,"-std::numeric_limits<double>::infinity()",&local_d0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  pp_Var1 = local_68;
  std::__cxx11::string::_M_replace
            (0x1db2b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1af701);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5cd;
  dVar3 = (double)(**(code **)(*(long *)d->px + 0x40))();
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)NAN(dVar3);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._0_8_ = "boost::math::isnan(d->decodeDouble())";
  local_f0._8_8_ = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d6e10;
  local_78 = &boost::unit_test::lazy_ostream::inst;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_40.m_end = "";
  local_70 = (lazy_ostream *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_88,&local_40,0x5cd,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1db2b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1af701);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5cf;
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = pp_Var1;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  fVar2 = (float)(**(code **)(*(long *)d->px + 0x38))();
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(INFINITY <= fVar2);
  local_110._0_4_ = 0x7f800000;
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_60.m_end = "";
  local_f8 = &local_108;
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d6e50;
  local_78 = &boost::unit_test::lazy_ostream::inst;
  local_70 = (lazy_ostream *)&local_f8;
  local_100 = &local_110;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001d6e50;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = &local_100;
  local_108._0_4_ = fVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_f0,&local_60,0x5cf,CHECK,CHECK_EQUAL,2,
             "d->decodeFloat()",&local_88,"std::numeric_limits<float>::infinity()",&local_d0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1db2b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1af701);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5d1;
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = pp_Var1;
  local_e0 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  fVar2 = (float)(**(code **)(*(long *)d->px + 0x38))();
  local_108 = (double)CONCAT44(local_108._4_4_,fVar2);
  local_110 = CONCAT44(local_110._4_4_,0xff800000);
  local_a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(fVar2 <= -INFINITY);
  local_a0.m_message.px = (element_type *)0x0;
  local_a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_60.m_end = "";
  local_f8 = &local_108;
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d6e50;
  local_78 = &boost::unit_test::lazy_ostream::inst;
  local_70 = (lazy_ostream *)&local_f8;
  local_100 = &local_110;
  local_d0.m_message.px = (element_type *)((ulong)local_d0.m_message.px & 0xffffffffffffff00);
  local_d0._0_8_ = &PTR__lazy_ostream_001d6e50;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_b8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_a0,(lazy_ostream *)local_f0,&local_60,0x5d1,CHECK,CHECK_EQUAL,2,
             "d->decodeFloat()",&local_88,"-std::numeric_limits<float>::infinity()",&local_d0);
  boost::detail::shared_count::~shared_count(&local_a0.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1db2b0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1af701);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x5d2;
  fVar2 = (float)(**(code **)(*(long *)d->px + 0x38))();
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)NAN(fVar2);
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0._0_8_ = "boost::math::isnan(d->decodeFloat())";
  local_f0._8_8_ = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001d6e10;
  local_78 = &boost::unit_test::lazy_ostream::inst;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/CodecTests.cc"
  ;
  local_50.m_end = "";
  local_70 = (lazy_ostream *)local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,&local_88,&local_50,0x5d2,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  if (_s2 != (long *)0x0) {
    (**(code **)(*_s2 + 8))();
  }
  if (s1._M_ptr != (OutputStream *)0x0) {
    (**(code **)(*(long *)s1._M_ptr + 8))();
  }
  return;
}

Assistant:

static void testLimits(const EncoderPtr& e, const DecoderPtr& d)
{
    std::auto_ptr<OutputStream> s1 = memoryOutputStream();
    {
        e->init(*s1);
        e->encodeDouble(std::numeric_limits<double>::infinity());
        e->encodeDouble(-std::numeric_limits<double>::infinity());
        e->encodeDouble(std::numeric_limits<double>::quiet_NaN());
        e->encodeFloat(std::numeric_limits<float>::infinity());
        e->encodeFloat(-std::numeric_limits<float>::infinity());
        e->encodeFloat(std::numeric_limits<float>::quiet_NaN());
        e->flush();
    }

    {
        std::auto_ptr<InputStream> s2 = memoryInputStream(*s1);
        d->init(*s2);
        BOOST_CHECK_EQUAL(d->decodeDouble(),
            std::numeric_limits<double>::infinity());
        BOOST_CHECK_EQUAL(d->decodeDouble(),
            -std::numeric_limits<double>::infinity());
        BOOST_CHECK(boost::math::isnan(d->decodeDouble()));
        BOOST_CHECK_EQUAL(d->decodeFloat(),
            std::numeric_limits<float>::infinity());
        BOOST_CHECK_EQUAL(d->decodeFloat(),
            -std::numeric_limits<float>::infinity());
        BOOST_CHECK(boost::math::isnan(d->decodeFloat()));
    }

}